

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O3

string * __thiscall
google::protobuf::internal::ExtensionSet::GetString
          (ExtensionSet *this,int number,string *default_value)

{
  Extension *pEVar1;
  
  pEVar1 = FindOrNull(this,number);
  if ((pEVar1 == (Extension *)0x0) || ((pEVar1->field_0xa & 2) != 0)) {
    return default_value;
  }
  if (pEVar1->is_repeated == false) {
    if (0xed < (byte)(pEVar1->type - 0x13)) {
      if (*(int *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)pEVar1->type * 4) == 9) {
        return (string *)(pEVar1->field_0).int64_t_value;
      }
      goto LAB_00283403;
    }
  }
  else {
    GetString();
  }
  GetString();
LAB_00283403:
  GetString();
}

Assistant:

const std::string& ExtensionSet::GetString(
    int number, const std::string& default_value) const {
  const Extension* extension = FindOrNull(number);
  if (extension == nullptr || extension->is_cleared) {
    // Not present.  Return the default value.
    return default_value;
  } else {
    ABSL_DCHECK_TYPE(*extension, OPTIONAL_FIELD, STRING);
    return *extension->ptr.string_value;
  }
}